

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

optional<sub_bound_token> *
read_right_bound_token
          (optional<sub_bound_token> *__return_storage_ptr__,string_view buf_1,string_view buf_2,
          string_view buf_3,string_view buf_4)

{
  undefined1 auVar1 [16];
  int iVar2;
  bool bVar3;
  _Storage<double,_true> _Var4;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  optional<operator_token> oVar9;
  optional<double> oVar10;
  undefined1 auVar8 [56];
  
  auVar8 = in_ZMM0._8_56_;
  oVar9 = read_operator(buf_1,buf_2);
  if (((undefined1  [12])
       oVar9.super__Optional_base<operator_token,_true,_true>._M_payload.
       super__Optional_payload_base<operator_token> & (undefined1  [12])0x1) ==
      (undefined1  [12])0x0) {
LAB_0012a0c2:
    bVar3 = false;
    goto LAB_0012a0c4;
  }
  if (oVar9.super__Optional_base<operator_token,_true,_true>._M_payload.
      super__Optional_payload_base<operator_token>._M_payload._4_4_ == 1) {
    __y._M_str = "+";
    __y._M_len = 1;
    bVar3 = std::operator==(buf_2,__y);
    if (bVar3) {
LAB_00129fca:
      __y_01._M_str = "-";
      __y_01._M_len = 1;
      bVar3 = std::operator==(buf_2,__y_01);
      oVar10 = read_real(buf_3);
      auVar6._0_8_ = oVar10.super__Optional_base<double,_true,_true>._M_payload.
                     super__Optional_payload_base<double>._M_payload;
      auVar6._8_56_ = auVar8;
      if (((undefined1  [16])
           oVar10.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_0012a0c2;
      auVar1._8_8_ = 0x8000000000000000;
      auVar1._0_8_ = 0x8000000000000000;
      auVar5 = vxorpd_avx512vl(auVar6._0_16_,auVar1);
      _Var4 = (_Storage<double,_true>)
              ((ulong)bVar3 * auVar5._0_8_ + (ulong)!bVar3 * (long)auVar6._0_8_);
      goto LAB_0012a0b0;
    }
    __y_00._M_str = "-";
    __y_00._M_len = 1;
    bVar3 = std::operator==(buf_2,__y_00);
    if (bVar3) goto LAB_00129fca;
    oVar10 = read_real(buf_2);
    _Var4 = oVar10.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_payload;
    if (((undefined1  [16])
         oVar10.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
    goto LAB_0012a0c2;
    iVar2 = 2;
  }
  else {
    __y_02._M_str = "+";
    __y_02._M_len = 1;
    bVar3 = std::operator==(buf_3,__y_02);
    if (bVar3) {
LAB_0012a049:
      __y_04._M_str = "-";
      __y_04._M_len = 1;
      bVar3 = std::operator==(buf_3,__y_04);
      oVar10 = read_real(buf_4);
      auVar7._0_8_ = oVar10.super__Optional_base<double,_true,_true>._M_payload.
                     super__Optional_payload_base<double>._M_payload;
      auVar7._8_56_ = auVar8;
      if (((undefined1  [16])
           oVar10.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar5._8_8_ = 0x8000000000000000;
        auVar5._0_8_ = 0x8000000000000000;
        auVar5 = vxorpd_avx512vl(auVar7._0_16_,auVar5);
        _Var4 = (_Storage<double,_true>)
                ((ulong)bVar3 * auVar5._0_8_ + (ulong)!bVar3 * (long)auVar7._0_8_);
        iVar2 = 4;
        goto LAB_0012a0b2;
      }
      goto LAB_0012a0c2;
    }
    __y_03._M_str = "-";
    __y_03._M_len = 1;
    bVar3 = std::operator==(buf_3,__y_03);
    if (bVar3) goto LAB_0012a049;
    oVar10 = read_real(buf_3);
    _Var4 = oVar10.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_payload;
    if (((undefined1  [16])
         oVar10.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
    goto LAB_0012a0c2;
LAB_0012a0b0:
    iVar2 = 3;
  }
LAB_0012a0b2:
  (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
  super__Optional_payload_base<sub_bound_token>._M_payload._M_value.value = (double)_Var4;
  (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
  super__Optional_payload_base<sub_bound_token>._M_payload._M_value.read = iVar2;
  bVar3 = true;
  (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
  super__Optional_payload_base<sub_bound_token>._M_payload._M_value.op =
       oVar9.super__Optional_base<operator_token,_true,_true>._M_payload.
       super__Optional_payload_base<operator_token>._M_payload._0_4_;
LAB_0012a0c4:
  (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
  super__Optional_payload_base<sub_bound_token>._M_engaged = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::optional<sub_bound_token>
read_right_bound_token(const std::string_view buf_1,
                       const std::string_view buf_2,
                       const std::string_view buf_3,
                       const std::string_view buf_4) noexcept
{
    double negative = 1.0;
    baryonyx::operator_type op = baryonyx::operator_type::equal;

    if (auto operator_token = read_operator(buf_1, buf_2); operator_token) {
        op = operator_token->op;
        if (operator_token->read == 1) {
            if (buf_2 == "+" || buf_2 == "-") {
                if (buf_2 == "-")
                    negative = -1.0;

                if (auto value_opt = read_real(buf_3); value_opt)
                    return sub_bound_token(negative * *value_opt, 3, op);
                else
                    return std::nullopt;
            } else {
                if (auto value_opt = read_real(buf_2); value_opt)
                    return sub_bound_token(negative * *value_opt, 2, op);
                else
                    return std::nullopt;
            }
        } else {
            if (buf_3 == "+" || buf_3 == "-") {
                if (buf_3 == "-")
                    negative = -1.0;

                if (auto value_opt = read_real(buf_4); value_opt)
                    return sub_bound_token(negative * *value_opt, 4, op);
                else
                    return std::nullopt;
            } else {
                if (auto value_opt = read_real(buf_3); value_opt)
                    return sub_bound_token(negative * *value_opt, 3, op);
                else
                    return std::nullopt;
            }
        }
    } else
        return std::nullopt;
}